

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# with_presence.cc
# Opt level: O3

void google::protobuf::compiler::rust::WithPresenceAccessorsInMsgImpl
               (Context *ctx,FieldDescriptor *field,AccessorCase accessor_case)

{
  long *plVar1;
  char cVar2;
  undefined8 extraout_RAX;
  char *in_RCX;
  FieldDescriptor *field_00;
  char *in_R9;
  void *unaff_R13;
  long lVar3;
  string_view sVar4;
  string_view lifetime;
  string field_name;
  AccessorCase local_690;
  anon_class_1_0_00000001 local_689;
  undefined1 *local_688;
  undefined8 local_680;
  undefined1 local_678;
  undefined7 uStack_677;
  undefined8 uStack_670;
  undefined1 *local_668;
  undefined8 local_660;
  undefined1 local_658;
  undefined7 uStack_657;
  undefined8 uStack_650;
  undefined1 *local_648;
  undefined8 local_640;
  undefined1 local_638;
  undefined7 uStack_637;
  undefined8 uStack_630;
  string local_628;
  string local_608;
  undefined1 local_5e8 [32];
  string local_5c8;
  string local_5a8;
  undefined1 local_588 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_578;
  string local_568;
  string_view local_548;
  Sub local_538 [4];
  undefined1 *local_258;
  undefined8 local_250;
  undefined1 local_248 [8];
  undefined8 uStack_240;
  undefined8 *local_238;
  undefined8 local_230;
  code *local_228;
  code *local_220;
  undefined1 local_218;
  undefined1 *local_210;
  undefined8 local_208;
  undefined1 local_200 [16];
  undefined1 local_1f0;
  undefined1 local_1a8;
  undefined1 *local_1a0;
  undefined8 local_198;
  undefined1 local_190 [8];
  undefined8 uStack_188;
  long *local_180;
  undefined8 local_178;
  code *local_170;
  code *local_168;
  undefined1 local_160;
  undefined1 *local_158;
  undefined8 local_150;
  undefined1 local_148 [16];
  undefined1 local_138;
  undefined1 local_f0;
  undefined1 *local_e8;
  undefined8 local_e0;
  undefined1 local_d8 [8];
  undefined8 uStack_d0;
  undefined8 *local_c8;
  undefined8 local_c0;
  code *local_b8;
  code *local_b0;
  undefined1 local_a8;
  undefined1 *local_a0;
  undefined8 local_98;
  undefined1 local_90 [16];
  undefined1 local_80;
  undefined1 local_38;
  
  local_690 = accessor_case;
  cVar2 = google::protobuf::FieldDescriptor::has_presence();
  if (cVar2 == '\0') {
    WithPresenceAccessorsInMsgImpl((rust *)local_538);
    lVar3 = 0x450;
    do {
      io::Printer::Sub::~Sub((Sub *)((long)&local_538[0].key_._M_dataplus._M_p + lVar3));
      lVar3 = lVar3 + -0xb8;
    } while (lVar3 != -0xb8);
    if (local_648 != (undefined1 *)unaff_R13) {
      operator_delete(local_648,CONCAT71(uStack_637,local_638) + 1);
    }
    if (local_688 != &local_678) {
      operator_delete(local_688,CONCAT71(uStack_677,local_678) + 1);
    }
    if (local_668 != &local_658) {
      operator_delete(local_668,CONCAT71(uStack_657,local_658) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_628._M_dataplus._M_p != &local_628.field_2) {
      operator_delete(local_628._M_dataplus._M_p,local_628.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_588._0_8_ != &local_578) {
      operator_delete((void *)local_588._0_8_,local_578._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_608._M_dataplus._M_p != &local_608.field_2) {
      operator_delete(local_608._M_dataplus._M_p,local_608.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_5e8._0_8_ != local_5e8 + 0x10) {
      operator_delete((void *)local_5e8._0_8_,local_5e8._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_568._M_dataplus._M_p != &local_568.field_2) {
      operator_delete(local_568._M_dataplus._M_p,local_568.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5c8._M_dataplus._M_p != &local_5c8.field_2) {
      operator_delete(local_5c8._M_dataplus._M_p,local_5c8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5a8._M_dataplus._M_p != &local_5a8.field_2) {
      operator_delete(local_5a8._M_dataplus._M_p,local_5a8.field_2._M_allocated_capacity + 1);
    }
    _Unwind_Resume(extraout_RAX);
  }
  FieldNameWithCollisionAvoidance_abi_cxx11_(&local_5a8,(rust *)field,field_00);
  local_5c8._M_dataplus._M_p = (pointer)&local_5c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5c8,"field","");
  sVar4._M_str = in_RCX;
  sVar4._M_len = (size_t)local_5a8._M_dataplus._M_p;
  RsSafeName_abi_cxx11_(&local_568,(rust *)local_5a8._M_string_length,sVar4);
  io::Printer::Sub::Sub<std::__cxx11::string>(local_538,&local_5c8,&local_568);
  local_5e8._0_8_ = local_5e8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5e8,"raw_field_name","");
  io::Printer::Sub::Sub<std::__cxx11::string&>(local_538 + 1,(string *)local_5e8,&local_5a8);
  local_608._M_dataplus._M_p = (pointer)&local_608.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_608,"view_type","");
  sVar4 = ViewLifetime(local_690);
  lifetime._M_str = in_R9;
  lifetime._M_len = (size_t)sVar4._M_str;
  RsViewType_abi_cxx11_
            ((string *)local_588,(rust *)ctx,(Context *)field,(FieldDescriptor *)sVar4._M_len,
             lifetime);
  io::Printer::Sub::Sub<std::__cxx11::string>
            (local_538 + 2,&local_608,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_588);
  local_628._M_dataplus._M_p = (pointer)&local_628.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_628,"view_self","");
  local_548 = ViewReceiver(local_690);
  io::Printer::Sub::Sub<std::basic_string_view<char,std::char_traits<char>>>
            (local_538 + 3,&local_628,&local_548);
  local_668 = &local_658;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_668,"hazzer","");
  local_258 = local_248;
  if (local_668 == &local_658) {
    uStack_240 = uStack_650;
  }
  else {
    local_258 = local_668;
  }
  local_250 = local_660;
  local_660 = 0;
  local_658 = 0;
  local_668 = &local_658;
  local_238 = (undefined8 *)operator_new(0x18);
  *local_238 = ctx;
  local_238[1] = field;
  *(undefined1 *)(local_238 + 2) = 0;
  local_220 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
              ::_M_invoke;
  local_230 = 0;
  local_228 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
              ::_M_manager;
  local_218 = 1;
  local_210 = local_200;
  local_208 = 0;
  local_200[0] = 0;
  local_1f0 = 0;
  std::__cxx11::string::_M_replace((ulong)&local_210,0,(char *)0x0,0x361ff2);
  local_1a8 = 0;
  local_688 = &local_678;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_688,"clearer","");
  local_1a0 = local_190;
  if (local_688 == &local_678) {
    uStack_188 = uStack_670;
  }
  else {
    local_1a0 = local_688;
  }
  local_198 = local_680;
  local_680 = 0;
  local_678 = 0;
  local_688 = &local_678;
  local_180 = (long *)operator_new(0x20);
  *local_180 = (long)&local_690;
  local_180[1] = (long)ctx;
  local_180[2] = (long)field;
  *(undefined1 *)(local_180 + 3) = 0;
  local_168 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
              ::_M_invoke;
  local_178 = 0;
  local_170 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
              ::_M_manager;
  local_160 = 1;
  local_158 = local_148;
  local_150 = 0;
  local_148[0] = 0;
  local_138 = 0;
  std::__cxx11::string::_M_replace((ulong)&local_158,0,(char *)0x0,0x361ff2);
  local_f0 = 0;
  local_648 = &local_638;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_648,"opt_getter","");
  local_e8 = local_d8;
  if (local_648 == &local_638) {
    uStack_d0 = uStack_630;
  }
  else {
    local_e8 = local_648;
  }
  local_e0 = local_640;
  local_640 = 0;
  local_638 = 0;
  local_648 = &local_638;
  local_c8 = (undefined8 *)operator_new(0x18);
  *local_c8 = field;
  local_c8[1] = ctx;
  *(undefined1 *)(local_c8 + 2) = 0;
  local_b0 = std::
             _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
             ::_M_invoke;
  local_c0 = 0;
  local_b8 = std::
             _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
             ::_M_manager;
  local_a8 = 1;
  local_a0 = local_90;
  local_98 = 0;
  local_90[0] = 0;
  local_80 = 0;
  std::__cxx11::string::_M_replace((ulong)&local_a0,0,(char *)0x0,0x361ff2);
  local_38 = 0;
  google::protobuf::io::Printer::Emit
            (ctx->printer_,local_538,7,0x31,"\n    $hazzer$\n    $clearer$\n    $opt_getter$\n    ")
  ;
  lVar3 = 0x508;
  do {
    if (*(char *)((long)&local_548._M_str + lVar3) == '\x01') {
      std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                ((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> *)
                 (local_588 + lVar3 + 8));
    }
    plVar1 = *(long **)((long)&local_5a8._M_dataplus._M_p + lVar3);
    if ((long *)(local_588 + lVar3 + -0x10) != plVar1) {
      operator_delete(plVar1,*(long *)(local_588 + lVar3 + -0x10) + 1);
    }
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
      ::_S_vtable._M_arr[(byte)local_5c8.field_2._M_local_buf[lVar3 + 8]]._M_data)
              (&local_689,
               (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                *)(local_5e8 + lVar3 + 0x18));
    local_5c8.field_2._M_local_buf[lVar3 + 8] = -1;
    if ((long *)(local_5e8 + lVar3 + 8) != *(long **)(local_5e8 + lVar3 + -8)) {
      operator_delete(*(long **)(local_5e8 + lVar3 + -8),*(long *)(local_5e8 + lVar3 + 8) + 1);
    }
    lVar3 = lVar3 + -0xb8;
  } while (lVar3 != 0);
  if (local_648 != &local_638) {
    operator_delete(local_648,CONCAT71(uStack_637,local_638) + 1);
  }
  if (local_688 != &local_678) {
    operator_delete(local_688,CONCAT71(uStack_677,local_678) + 1);
  }
  if (local_668 != &local_658) {
    operator_delete(local_668,CONCAT71(uStack_657,local_658) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_628._M_dataplus._M_p != &local_628.field_2) {
    operator_delete(local_628._M_dataplus._M_p,local_628.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_588._0_8_ != &local_578) {
    operator_delete((void *)local_588._0_8_,local_578._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_608._M_dataplus._M_p != &local_608.field_2) {
    operator_delete(local_608._M_dataplus._M_p,local_608.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_5e8._0_8_ != local_5e8 + 0x10) {
    operator_delete((void *)local_5e8._0_8_,local_5e8._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_568._M_dataplus._M_p != &local_568.field_2) {
    operator_delete(local_568._M_dataplus._M_p,local_568.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5c8._M_dataplus._M_p != &local_5c8.field_2) {
    operator_delete(local_5c8._M_dataplus._M_p,local_5c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5a8._M_dataplus._M_p != &local_5a8.field_2) {
    operator_delete(local_5a8._M_dataplus._M_p,local_5a8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void WithPresenceAccessorsInMsgImpl(Context& ctx, const FieldDescriptor& field,
                                    AccessorCase accessor_case) {
  ABSL_CHECK(field.has_presence());

  std::string field_name = FieldNameWithCollisionAvoidance(field);

  ctx.Emit(
      {{"field", RsSafeName(field_name)},
       {"raw_field_name", field_name},  // Never r# prefixed
       {"view_type", RsViewType(ctx, field, ViewLifetime(accessor_case))},
       {"view_self", ViewReceiver(accessor_case)},
       {"hazzer",
        [&] {
          if (ctx.is_cpp()) {
            ctx.Emit({{"hazzer_thunk", ThunkName(ctx, field, "has")}},
                     R"rs(
                  pub fn has_$raw_field_name$($view_self$) -> bool {
                    unsafe {
                      $hazzer_thunk$(self.raw_msg())
                    }
                  }
                  )rs");
          } else {
            ctx.Emit({{"upb_mt_field_index", UpbMiniTableFieldIndex(field)}},
                     R"rs(
                  pub fn has_$raw_field_name$($view_self$) -> bool {
                    unsafe {
                      let f = $pbr$::upb_MiniTable_GetFieldByIndex(
                          <Self as $pbr$::AssociatedMiniTable>::mini_table(),
                          $upb_mt_field_index$);
                      $pbr$::upb_Message_HasBaseField(self.raw_msg(), f)
                    }
                  }
                  )rs");
          }
        }},
       {"clearer",
        [&] {
          if (accessor_case == AccessorCase::VIEW) return;
          if (ctx.is_cpp()) {
            ctx.Emit({{"clearer_thunk", ThunkName(ctx, field, "clear")}},
                     R"rs(
                    pub fn clear_$raw_field_name$(&mut self) {
                      unsafe { $clearer_thunk$(self.raw_msg()) }
                    })rs");
          } else {
            ctx.Emit({{"upb_mt_field_index", UpbMiniTableFieldIndex(field)}},
                     R"rs(
                    pub fn clear_$raw_field_name$(&mut self) {
                      unsafe {
                        let mt = <Self as $pbr$::AssociatedMiniTable>::mini_table();
                        let f = $pbr$::upb_MiniTable_GetFieldByIndex(
                            mt, $upb_mt_field_index$);
                        $pbr$::upb_Message_ClearBaseField(self.raw_msg(), f);
                      }
                    })rs");
          }
        }},
       {"opt_getter",
        [&] {
          // Cord fields don't support the _opt getter.
          if (field.options().ctype() == FieldOptions::CORD) return;
          ctx.Emit(
              R"rs(
              pub fn $raw_field_name$_opt($view_self$) -> $pb$::Optional<$view_type$> {
                    $pb$::Optional::new(self.$field$(), self.has_$raw_field_name$())
              }
              )rs");
        }}},
      R"rs(
    $hazzer$
    $clearer$
    $opt_getter$
    )rs");
}